

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O3

void __thiscall CompilerContext::compile_continue(CompilerContext *this,SyntaxTree *continue_node)

{
  Command *command;
  pointer pLVar1;
  __normal_iterator<CompilerContext::LoopInfo_*,_std::vector<CompilerContext::LoopInfo,_std::allocator<CompilerContext::LoopInfo>_>_>
  __tmp;
  pointer pLVar2;
  unreachable_exception *this_00;
  initializer_list<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>
  __l;
  allocator_type local_61;
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  local_60;
  anon_union_48_3_1618c560_for__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false>_3
  local_48;
  undefined8 local_18;
  
  pLVar1 = (this->loop_stack).
           super__Vector_base<CompilerContext::LoopInfo,_std::allocator<CompilerContext::LoopInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    pLVar2 = pLVar1;
    if (pLVar2 == (this->loop_stack).
                  super__Vector_base<CompilerContext::LoopInfo,_std::allocator<CompilerContext::LoopInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      this_00 = (unreachable_exception *)__cxa_allocate_exception(0x10);
      unreachable_exception::unreachable_exception
                (this_00,
                 "Unreachable code reached at /workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/compiler.cpp(517)."
                );
      __cxa_throw(this_00,&unreachable_exception::typeinfo,std::runtime_error::~runtime_error);
    }
    local_48._0_8_ =
         pLVar2[-1].continue_label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pLVar1 = pLVar2 + -1;
  } while ((element_type *)local_48._0_8_ == (element_type *)0x0);
  command = (this->commands->goto_).ref;
  if (command != (Command *)0x0) {
    local_48._8_8_ =
         pLVar2[-1].continue_label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount
         ._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_)->_M_use_count + 1;
      }
    }
    local_18 = 6;
    __l._M_len = 1;
    __l._M_array = (iterator)&local_48;
    std::
    vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
    ::vector(&local_60,__l,&local_61);
    compile_command(this,command,&local_60,false);
    std::
    vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
    ::~vector(&local_60);
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
    ::_destroy((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
                *)&local_48._tail);
    return;
  }
  __assert_fail("!\"ref\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/deps/optional/include/optional/optional.hpp"
                ,0x2ac,
                "auto std::experimental::optional<const Command &>::operator*()::(anonymous class)::operator()() const [T = const Command &]"
               );
}

Assistant:

void CompilerContext::compile_continue(const SyntaxTree& continue_node)
{
    for(auto it = loop_stack.rbegin(); it != loop_stack.rend(); ++it)
    {
        if(it->continue_label)
        {
            compile_command(*commands.goto_, { it->continue_label });
            return;
        }
    }
    Unreachable();
}